

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *pMVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  Rep *pRVar3;
  once_flag *poVar4;
  Arena *pAVar5;
  bool bVar6;
  string sVar7;
  int iVar8;
  uint32 uVar9;
  undefined4 extraout_var;
  MapKey *field;
  undefined4 extraout_var_00;
  MapKey *field_00;
  LogMessage *other;
  MapValueRef *pMVar10;
  Message *pMVar11;
  undefined4 extraout_var_01;
  string *this_00;
  double dVar12;
  Reflection *this_01;
  void **ppvVar13;
  void **ppvVar14;
  float fVar15;
  string local_e8;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_c8;
  undefined1 local_c0 [16];
  Node local_b0;
  DynamicMapField *local_88;
  TrivialKey local_80;
  undefined1 auStack_78 [8];
  iterator iter;
  int local_58;
  
  pMVar1 = &this->map_;
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar8 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  field = (MapKey *)Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar8));
  iVar8 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  field_00 = (MapKey *)Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar8));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    local_c0._8_8_ = (this->map_).elements_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                  *)local_c0,((InnerMap *)local_c0._8_8_)->index_of_first_non_null_);
    iter.it_.m_ = (InnerMap *)local_b0.kv.k_.key_;
    auStack_78 = (undefined1  [8])local_c0._0_8_;
    iter.it_.node_ = (Node *)local_c0._8_8_;
    if ((Node *)local_c0._0_8_ != (Node *)0x0) {
      do {
        MapValueRef::DeleteData(&(*(value_type **)((long)auStack_78 + 8))->second);
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
        ::operator++((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                      *)auStack_78);
      } while (auStack_78 != (undefined1  [8])0x0);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(pMVar1);
  pRVar2 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  if ((pRVar2->super_RepeatedPtrFieldBase).current_size_ != 0) {
    pRVar3 = (pRVar2->super_RepeatedPtrFieldBase).rep_;
    ppvVar14 = pRVar3->elements;
    local_c8 = pMVar1;
    local_88 = this;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar14 = (void **)0x0;
    }
    do {
      pMVar1 = local_c8;
      local_58 = 0;
      poVar4 = *(once_flag **)((long)&field[1].val_ + 8);
      if (poVar4 != (once_flag *)0x0) {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80.key_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar4,(_func_void_FieldDescriptor_ptr **)local_c0,(FieldDescriptor **)&local_80)
        ;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap +
              (ulong)*(uint *)((long)&field[1].val_ + 0x10) * 4)) {
      case 1:
        uVar9 = Reflection::GetInt32(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        local_58 = 1;
        goto LAB_002db068;
      case 2:
        auStack_78 = (undefined1  [8])
                     Reflection::GetInt64(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        local_58 = 2;
        break;
      case 3:
        uVar9 = Reflection::GetUInt32(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        local_58 = 3;
LAB_002db068:
        auStack_78._0_4_ = uVar9;
        break;
      case 4:
        auStack_78 = (undefined1  [8])
                     Reflection::GetUInt64(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        local_58 = 4;
        break;
      case 5:
      case 6:
      case 8:
      case 10:
        LogMessage::LogMessage
                  ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map_field.cc"
                   ,0x1e7);
        other = LogMessage::operator<<((LogMessage *)local_c0,"Can\'t get here.");
        LogFinisher::operator=((LogFinisher *)&local_80,other);
        LogMessage::~LogMessage((LogMessage *)local_c0);
        break;
      case 7:
        bVar6 = Reflection::GetBool(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        local_58 = 7;
        auStack_78[0] = bVar6;
        break;
      case 9:
        Reflection::GetString_abi_cxx11_
                  (&local_e8,this_01,(Message *)*ppvVar14,(FieldDescriptor *)field);
        auStack_78 = (undefined1  [8])&iter.it_.m_;
        iter.it_.m_ = (InnerMap *)((ulong)iter.it_.m_ & 0xffffffffffffff00);
        local_58 = 9;
        iter.it_.node_ = (Node *)0x0;
        std::__cxx11::string::operator=((string *)auStack_78,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
      }
      if ((this->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase.arena_ == (Arena *)0x0) {
        local_80.key_ = (MapKey *)auStack_78;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                  ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                    *)local_c0,(this->map_).elements_,&local_80,(TreeIterator *)0x0);
        if ((Node *)local_c0._0_8_ != (Node *)0x0) {
          MapValueRef::DeleteData(&(*(value_type **)(local_c0._0_8_ + 8))->second);
        }
      }
      pMVar10 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                          (pMVar1,(key_type *)auStack_78);
      poVar4 = *(once_flag **)((long)&field_00[1].val_ + 8);
      if (poVar4 == (once_flag *)0x0) {
        iVar8 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)((long)&field_00[1].val_ + 0x10) * 4);
        pMVar10->type_ = iVar8;
      }
      else {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80.key_ = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar4,(_func_void_FieldDescriptor_ptr **)local_c0,(FieldDescriptor **)&local_80)
        ;
        poVar4 = *(once_flag **)((long)&field_00[1].val_ + 8);
        iVar8 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)((long)&field_00[1].val_ + 0x10) * 4);
        pMVar10->type_ = iVar8;
        if (poVar4 != (once_flag *)0x0) {
          local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_80.key_ = field_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar4,(_func_void_FieldDescriptor_ptr **)local_c0,
                     (FieldDescriptor **)&local_80);
          iVar8 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                          (ulong)*(uint *)((long)&field_00[1].val_ + 0x10) * 4);
        }
      }
      switch(iVar8) {
      case 1:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(4);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&int::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(undefined4 *)this_00 = 0;
        uVar9 = Reflection::GetInt32(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        goto LAB_002db49d;
      case 2:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(8);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&long::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(double *)this_00 = 0.0;
        dVar12 = (double)Reflection::GetInt64
                                   (this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        goto LAB_002db4cc;
      case 3:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(4);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&unsigned_int::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(undefined4 *)this_00 = 0;
        uVar9 = Reflection::GetUInt32(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        goto LAB_002db49d;
      case 4:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(8);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&unsigned_long::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(double *)this_00 = 0.0;
        dVar12 = (double)Reflection::GetUInt64
                                   (this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
LAB_002db4cc:
        *(double *)this_00 = dVar12;
        break;
      case 5:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(8);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&double::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(double *)this_00 = 0.0;
        dVar12 = Reflection::GetDouble(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        *(double *)this_00 = dVar12;
        break;
      case 6:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(4);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&float::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(undefined4 *)this_00 = 0;
        fVar15 = Reflection::GetFloat(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        *(float *)this_00 = fVar15;
        break;
      case 7:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(1);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&bool::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *this_00 = (string)0x0;
        sVar7 = (string)Reflection::GetBool(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00
                                           );
        *this_00 = sVar7;
        break;
      case 8:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(4);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&int::typeinfo,8);
          }
          this_00 = (string *)Arena::AllocateAlignedNoHook(pAVar5,8);
        }
        *(undefined4 *)this_00 = 0;
        uVar9 = Reflection::GetEnumValue(this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
LAB_002db49d:
        *(uint32 *)this_00 = uVar9;
        break;
      case 9:
        pAVar5 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar5 == (Arena *)0x0) {
          this_00 = (string *)operator_new(0x20);
        }
        else {
          if (pAVar5->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          }
          this_00 = (string *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar5->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
        }
        *(string **)this_00 = this_00 + 0x10;
        *(undefined8 *)(this_00 + 8) = 0;
        this_00[0x10] = (string)0x0;
        Reflection::GetString_abi_cxx11_
                  ((string *)local_c0,this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00);
        std::__cxx11::string::operator=(this_00,(string *)local_c0);
        if ((Node *)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_);
        }
        break;
      case 10:
        pMVar11 = Reflection::GetMessage
                            (this_01,(Message *)*ppvVar14,(FieldDescriptor *)field_00,
                             (MessageFactory *)0x0);
        iVar8 = (*(pMVar11->super_MessageLite)._vptr_MessageLite[4])
                          (pMVar11,(local_88->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
        this_00 = (string *)CONCAT44(extraout_var_01,iVar8);
        (**(code **)((long)*(double *)this_00 + 0x70))(this_00,pMVar11);
        break;
      default:
        goto switchD_002db1e6_default;
      }
      pMVar10->data_ = this_00;
      this = local_88;
switchD_002db1e6_default:
      if ((local_58 == 9) && (auStack_78 != (undefined1  [8])&iter.it_.m_)) {
        operator_delete((void *)auStack_78);
      }
      ppvVar14 = ppvVar14 + 1;
      pRVar2 = (this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_;
      pRVar3 = (pRVar2->super_RepeatedPtrFieldBase).rep_;
      ppvVar13 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar13 = (void **)0x0;
      }
    } while (ppvVar14 != ppvVar13 + (pRVar2->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}